

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O0

void remove_expectation_for(char *function)

{
  int iVar1;
  CgreenVector *vector;
  char *in_RDI;
  RecordedExpectation *expectation;
  int i;
  CgreenVector *in_stack_ffffffffffffffd8;
  int position;
  int local_c;
  
  local_c = 0;
  do {
    position = local_c;
    iVar1 = cgreen_vector_size(global_expectation_queue);
    if (iVar1 <= position) {
      return;
    }
    vector = (CgreenVector *)cgreen_vector_get(in_stack_ffffffffffffffd8,0);
    if (vector == (CgreenVector *)0x0) {
      fprintf(_stderr,"*** CGREEN: NULL expectation found -- maybe a previous incorrect removal?");
    }
    else {
      iVar1 = strcmp(*(char **)vector,in_RDI);
      if (iVar1 == 0) {
        cgreen_vector_remove(vector,position);
        return;
      }
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

static void remove_expectation_for(const char *function) {
    int i;
    for (i = 0; i < cgreen_vector_size(global_expectation_queue); i++) {
        RecordedExpectation *expectation = (RecordedExpectation *)cgreen_vector_get(global_expectation_queue, i);

        if (NULL == expectation) {
            fprintf(stderr, "*** CGREEN: NULL expectation found -- maybe a previous incorrect removal?");
            continue;
        }

        if (strcmp(expectation->function, function) == 0) {
            cgreen_vector_remove(global_expectation_queue, i);
            return;
        }
    }
}